

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

istream * __thiscall nivalis::Environment::from_bin(Environment *this,istream *is)

{
  Expr *pEVar1;
  size_type sVar2;
  istream *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_t i_1;
  size_t i;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  istream *in_stack_ffffffffffffffb0;
  istream *is_00;
  istream *in_stack_ffffffffffffffc8;
  Expr *this_00;
  ulong local_20;
  Expr *local_18;
  
  util::resize_from_read_bin<std::vector<double,std::allocator<double>>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_18 = (Expr *)0x0;
  while( true ) {
    this_00 = local_18;
    pEVar1 = (Expr *)std::vector<double,_std::allocator<double>_>::size(in_RDI);
    if (pEVar1 <= this_00) break;
    in_stack_ffffffffffffffc8 = in_RSI;
    std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)local_18);
    util::read_bin<double>(in_stack_ffffffffffffffb0,(double *)in_stack_ffffffffffffffa8);
    local_18 = (Expr *)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_18->ast)->_M_impl).super__Vector_impl_data._M_start + 1);
  }
  std::vector<double,_std::allocator<double>_>::size(in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00,(size_type)in_stack_ffffffffffffffc8);
  util::
  resize_from_read_bin<std::vector<nivalis::Environment::UserFunction,std::allocator<nivalis::Environment::UserFunction>>>
            (in_stack_ffffffffffffffb0,
             (vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
              *)in_stack_ffffffffffffffa8);
  local_20 = 0;
  while( true ) {
    sVar2 = std::
            vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
            ::size((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                    *)(in_RDI + 2));
    if (sVar2 <= local_20) break;
    std::
    vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
    ::operator[]((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                  *)(in_RDI + 2),local_20);
    Expr::from_bin(this_00,in_stack_ffffffffffffffc8);
    is_00 = in_RSI;
    std::
    vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
    ::operator[]((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                  *)(in_RDI + 2),local_20);
    util::read_bin<unsigned_long>(is_00,(unsigned_long *)in_stack_ffffffffffffffa8);
    local_20 = local_20 + 1;
  }
  return in_RSI;
}

Assistant:

std::istream& Environment::from_bin(std::istream& is) {
    util::resize_from_read_bin(is, vars);
    for (size_t i = 0; i < vars.size(); ++i) {
        util::read_bin(is, vars[i]);
    }
    varname.resize(vars.size());
    util::resize_from_read_bin(is, funcs);
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].expr.from_bin(is);
        util::read_bin(is, funcs[i].n_args);
    }
    return is;
}